

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplexmain.cpp
# Opt level: O0

void printPrimalSolution<double>
               (SoPlexBase<double> *soplex,NameSet *colnames,NameSet *rownames,bool real,
               bool rational)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  Verbosity VVar4;
  int iVar5;
  element_type *peVar6;
  SPxOut *_spxout;
  SPxOut *manip;
  byte in_CL;
  long in_RDI;
  byte in_R8B;
  Real __x;
  double dVar7;
  Verbosity old_verbosity_13;
  Verbosity old_verbosity_12;
  Verbosity old_verbosity_11;
  int i_3;
  Verbosity old_verbosity_10;
  int nNonzeros_1;
  Verbosity old_verbosity_9;
  Verbosity old_verbosity_8;
  int i_2;
  Verbosity old_verbosity_7;
  VectorRational primal_1;
  Verbosity old_verbosity_6;
  Verbosity old_verbosity_5;
  Verbosity old_verbosity_4;
  int i_1;
  Verbosity old_verbosity_3;
  int nNonzeros;
  Verbosity old_verbosity_2;
  Verbosity old_verbosity_1;
  int i;
  Verbosity old_verbosity;
  VectorBase<double> primal;
  int printwidth;
  int printprec;
  SoPlexBase<double> *in_stack_fffffffffffffa98;
  SoPlexBase<double> *in_stack_fffffffffffffaa0;
  SoPlexBase<double> *in_stack_fffffffffffffaa8;
  SPxOut *in_stack_fffffffffffffab0;
  undefined4 in_stack_fffffffffffffae8;
  undefined4 in_stack_fffffffffffffaec;
  int iVar8;
  undefined4 in_stack_fffffffffffffaf0;
  undefined2 in_stack_fffffffffffffaf4;
  undefined1 in_stack_fffffffffffffaf6;
  undefined1 in_stack_fffffffffffffaf7;
  SPxOut *in_stack_fffffffffffffaf8;
  Verbosity local_318;
  Verbosity local_314 [3];
  undefined1 local_308 [68];
  Verbosity local_2c4;
  Verbosity local_2c0 [2];
  undefined1 local_2b8 [72];
  int local_270;
  Verbosity local_26c;
  Verbosity local_268;
  int local_264;
  Verbosity local_260;
  Verbosity local_25c;
  undefined1 local_258 [76];
  int local_20c;
  int local_208;
  Verbosity local_204;
  Verbosity local_200 [2];
  undefined1 local_1f8 [76];
  int local_1ac;
  Verbosity local_1a8;
  Verbosity local_1a4 [8];
  Verbosity local_184;
  Verbosity local_180;
  int local_17c;
  int local_164;
  Verbosity local_160;
  Verbosity local_15c;
  int local_158;
  int local_154;
  Verbosity local_150;
  Verbosity local_14c [6];
  int local_134;
  Verbosity local_130;
  Verbosity local_12c;
  int local_128;
  int local_124;
  int local_10c;
  Verbosity local_108;
  Verbosity local_104;
  int local_100;
  int local_fc;
  Verbosity local_f8;
  Verbosity local_f4 [6];
  int local_dc;
  Verbosity local_d8;
  Verbosity local_d4 [16];
  int local_94;
  int local_90;
  byte local_8a;
  byte local_89;
  long local_78;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_70;
  undefined1 *local_68;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_60;
  undefined1 *local_58;
  undefined8 local_50;
  undefined8 local_48;
  Verbosity *local_40;
  undefined1 *local_38;
  undefined8 local_30;
  undefined8 local_28;
  Verbosity *local_20;
  undefined1 *local_18;
  Verbosity *local_10;
  Verbosity *local_8;
  
  local_89 = in_CL & 1;
  local_8a = in_R8B & 1;
  local_78 = in_RDI;
  ::soplex::SoPlexBase<double>::tolerances(in_stack_fffffffffffffa98);
  peVar6 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x134abf);
  __x = ::soplex::Tolerances::epsilon(peVar6);
  dVar7 = log10(__x);
  local_90 = (int)-dVar7;
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x134b0f);
  local_94 = local_90 + 10;
  if ((local_89 & 1) != 0) {
    ::soplex::SoPlexBase<double>::numCols((SoPlexBase<double> *)0x134b3b);
    ::soplex::VectorBase<double>::VectorBase
              ((VectorBase<double> *)in_stack_fffffffffffffab0,
               (int)((ulong)in_stack_fffffffffffffaa8 >> 0x20));
    bVar1 = ::soplex::SoPlexBase<double>::getPrimalRay
                      (in_stack_fffffffffffffaa8,(VectorBase<double> *)in_stack_fffffffffffffaa0);
    if (bVar1) {
      if ((local_78 != -8) &&
         (VVar4 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_78 + 8)), 2 < (int)VVar4)) {
        local_d4[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_78 + 8));
        local_d8 = INFO1;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_78 + 8),&local_d8);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98);
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_78 + 8),local_d4);
      }
      for (local_dc = 0; iVar8 = local_dc,
          iVar5 = ::soplex::SoPlexBase<double>::numCols((SoPlexBase<double> *)0x134c8e),
          iVar8 < iVar5; local_dc = local_dc + 1) {
        ::soplex::VectorBase<double>::operator[]
                  ((VectorBase<double> *)in_stack_fffffffffffffaa0,
                   (int)((ulong)in_stack_fffffffffffffa98 >> 0x20));
        ::soplex::SoPlexBase<double>::tolerances(in_stack_fffffffffffffa98);
        peVar6 = std::
                 __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x134cf8);
        ::soplex::Tolerances::epsilon(peVar6);
        bVar1 = ::soplex::isNotZero<double,double>
                          ((double)in_stack_fffffffffffffaa0,(double)in_stack_fffffffffffffa98);
        std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x134d38)
        ;
        if (((bVar1) && (local_78 != -8)) &&
           (VVar4 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_78 + 8)), 2 < (int)VVar4)) {
          local_f4[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_78 + 8));
          local_f8 = INFO1;
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_78 + 8),&local_f8);
          ::soplex::NameSet::operator[]
                    ((NameSet *)in_stack_fffffffffffffaa0,
                     (int)((ulong)in_stack_fffffffffffffa98 >> 0x20));
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98);
          local_fc = (int)std::setw(local_94);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffffa98,
                     (_Setw)(int)((ulong)in_stack_fffffffffffffaa0 >> 0x20));
          local_100 = (int)std::setprecision(local_90);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffffa98,
                     (_Setprecision)(int)((ulong)in_stack_fffffffffffffaa0 >> 0x20));
          ::soplex::VectorBase<double>::operator[]
                    ((VectorBase<double> *)in_stack_fffffffffffffaa0,
                     (int)((ulong)in_stack_fffffffffffffa98 >> 0x20));
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffffaa0,(double)in_stack_fffffffffffffa98);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffffaa0,
                     (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffa98);
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_78 + 8),local_f4);
        }
      }
      if ((local_78 != -8) &&
         (VVar4 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_78 + 8)), 2 < (int)VVar4)) {
        local_104 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_78 + 8));
        local_108 = INFO1;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_78 + 8),&local_108);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98);
        local_10c = (int)std::setprecision(1);
        ::soplex::operator<<
                  ((SPxOut *)in_stack_fffffffffffffa98,
                   (_Setprecision)(int)((ulong)in_stack_fffffffffffffaa0 >> 0x20));
        ::soplex::operator<<
                  ((SPxOut *)in_stack_fffffffffffffaa0,
                   (_func_ios_base_ptr_ios_base_ptr *)in_stack_fffffffffffffa98);
        ::soplex::SoPlexBase<double>::tolerances(in_stack_fffffffffffffa98);
        peVar6 = std::
                 __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x135038);
        ::soplex::Tolerances::epsilon(peVar6);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffffaa0,(double)in_stack_fffffffffffffa98);
        local_124 = (int)std::setprecision(8);
        ::soplex::operator<<
                  ((SPxOut *)in_stack_fffffffffffffa98,
                   (_Setprecision)(int)((ulong)in_stack_fffffffffffffaa0 >> 0x20));
        ::soplex::operator<<
                  ((SPxOut *)in_stack_fffffffffffffaa0,
                   (_func_ios_base_ptr_ios_base_ptr *)in_stack_fffffffffffffa98);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98);
        ::soplex::operator<<
                  ((SPxOut *)in_stack_fffffffffffffaa0,
                   (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffa98);
        std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x1350f9)
        ;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_78 + 8),&local_104);
      }
    }
    else {
      bVar1 = ::soplex::SoPlexBase<double>::isPrimalFeasible(in_stack_fffffffffffffaa0);
      if ((bVar1) &&
         (bVar1 = ::soplex::SoPlexBase<double>::getPrimal
                            (in_stack_fffffffffffffaa8,
                             (VectorBase<double> *)in_stack_fffffffffffffaa0), bVar1)) {
        local_128 = 0;
        if ((local_78 != -8) &&
           (VVar4 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_78 + 8)), 2 < (int)VVar4)) {
          local_12c = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_78 + 8));
          local_130 = INFO1;
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_78 + 8),&local_130);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98);
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_78 + 8),&local_12c);
        }
        for (local_134 = 0; iVar8 = local_134,
            iVar5 = ::soplex::SoPlexBase<double>::numCols((SoPlexBase<double> *)0x135269),
            iVar8 < iVar5; local_134 = local_134 + 1) {
          ::soplex::VectorBase<double>::operator[]
                    ((VectorBase<double> *)in_stack_fffffffffffffaa0,
                     (int)((ulong)in_stack_fffffffffffffa98 >> 0x20));
          ::soplex::SoPlexBase<double>::tolerances(in_stack_fffffffffffffa98);
          peVar6 = std::
                   __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1352d3);
          ::soplex::Tolerances::epsilon(peVar6);
          bVar1 = ::soplex::isNotZero<double,double>
                            ((double)in_stack_fffffffffffffaa0,(double)in_stack_fffffffffffffa98);
          std::shared_ptr<soplex::Tolerances>::~shared_ptr
                    ((shared_ptr<soplex::Tolerances> *)0x135313);
          if (bVar1) {
            if ((local_78 != -8) &&
               (VVar4 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_78 + 8)), 2 < (int)VVar4)) {
              local_14c[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_78 + 8));
              local_150 = INFO1;
              ::soplex::SPxOut::setVerbosity((SPxOut *)(local_78 + 8),&local_150);
              ::soplex::NameSet::operator[]
                        ((NameSet *)in_stack_fffffffffffffaa0,
                         (int)((ulong)in_stack_fffffffffffffa98 >> 0x20));
              ::soplex::operator<<
                        ((SPxOut *)in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98);
              ::soplex::operator<<
                        ((SPxOut *)in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98);
              local_154 = (int)std::setw(local_94);
              ::soplex::operator<<
                        ((SPxOut *)in_stack_fffffffffffffa98,
                         (_Setw)(int)((ulong)in_stack_fffffffffffffaa0 >> 0x20));
              local_158 = (int)std::setprecision(local_90);
              ::soplex::operator<<
                        ((SPxOut *)in_stack_fffffffffffffa98,
                         (_Setprecision)(int)((ulong)in_stack_fffffffffffffaa0 >> 0x20));
              ::soplex::VectorBase<double>::operator[]
                        ((VectorBase<double> *)in_stack_fffffffffffffaa0,
                         (int)((ulong)in_stack_fffffffffffffa98 >> 0x20));
              ::soplex::operator<<
                        ((SPxOut *)in_stack_fffffffffffffaa0,(double)in_stack_fffffffffffffa98);
              ::soplex::operator<<
                        ((SPxOut *)in_stack_fffffffffffffaa0,
                         (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffa98);
              ::soplex::SPxOut::setVerbosity((SPxOut *)(local_78 + 8),local_14c);
            }
            local_128 = local_128 + 1;
          }
        }
        if ((local_78 != -8) &&
           (VVar4 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_78 + 8)), 2 < (int)VVar4)) {
          local_15c = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_78 + 8));
          local_160 = INFO1;
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_78 + 8),&local_160);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98);
          local_164 = (int)std::setprecision(1);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffffa98,
                     (_Setprecision)(int)((ulong)in_stack_fffffffffffffaa0 >> 0x20));
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffffaa0,
                     (_func_ios_base_ptr_ios_base_ptr *)in_stack_fffffffffffffa98);
          ::soplex::SoPlexBase<double>::tolerances(in_stack_fffffffffffffa98);
          peVar6 = std::
                   __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x135622);
          ::soplex::Tolerances::epsilon(peVar6);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffffaa0,(double)in_stack_fffffffffffffa98);
          local_17c = (int)std::setprecision(8);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffffa98,
                     (_Setprecision)(int)((ulong)in_stack_fffffffffffffaa0 >> 0x20));
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffffaa0,
                     (_func_ios_base_ptr_ios_base_ptr *)in_stack_fffffffffffffa98);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffffaa0,
                     (int)((ulong)in_stack_fffffffffffffa98 >> 0x20));
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffffaa0,
                     (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffa98);
          std::shared_ptr<soplex::Tolerances>::~shared_ptr
                    ((shared_ptr<soplex::Tolerances> *)0x13571f);
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_78 + 8),&local_15c);
        }
      }
      else if ((local_78 != -8) &&
              (VVar4 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_78 + 8)), 2 < (int)VVar4)) {
        local_180 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_78 + 8));
        local_184 = INFO1;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_78 + 8),&local_184);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98);
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_78 + 8),&local_180);
      }
    }
    ::soplex::VectorBase<double>::~VectorBase((VectorBase<double> *)0x13581b);
  }
  if ((local_8a & 1) != 0) {
    ::soplex::SoPlexBase<double>::numCols((SoPlexBase<double> *)0x13584a);
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)in_stack_fffffffffffffab0,(int)((ulong)in_stack_fffffffffffffaa8 >> 0x20));
    bVar1 = ::soplex::SoPlexBase<double>::getPrimalRayRational
                      (in_stack_fffffffffffffaa8,
                       (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *)in_stack_fffffffffffffaa0);
    if (bVar1) {
      if ((local_78 != -8) &&
         (VVar4 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_78 + 8)), 2 < (int)VVar4)) {
        local_1a4[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_78 + 8));
        local_1a8 = INFO1;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_78 + 8),&local_1a8);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98);
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_78 + 8),local_1a4);
      }
      for (local_1ac = 0; iVar8 = local_1ac,
          iVar5 = ::soplex::SoPlexBase<double>::numCols((SoPlexBase<double> *)0x135977),
          iVar8 < iVar5; local_1ac = local_1ac + 1) {
        ::soplex::
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)in_stack_fffffffffffffaa0,(int)((ulong)in_stack_fffffffffffffa98 >> 0x20));
        local_200[1] = 0;
        local_38 = local_1f8;
        local_40 = local_200 + 1;
        local_48 = 0;
        local_50 = 0;
        local_8 = local_40;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)in_stack_fffffffffffffaf8,
                   (longlong *)
                   CONCAT17(in_stack_fffffffffffffaf7,
                            CONCAT16(in_stack_fffffffffffffaf6,
                                     CONCAT24(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0)))
                   ,(type *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
        bVar1 = boost::multiprecision::operator!=
                          ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)in_stack_fffffffffffffa98,
                           (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)0x135a3e);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
        ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                   *)0x135a54);
        if (((bVar1) && (local_78 != -8)) &&
           (VVar4 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_78 + 8)), 2 < (int)VVar4)) {
          local_200[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_78 + 8));
          local_204 = INFO1;
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_78 + 8),&local_204);
          ::soplex::NameSet::operator[]
                    ((NameSet *)in_stack_fffffffffffffaa0,
                     (int)((ulong)in_stack_fffffffffffffa98 >> 0x20));
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98);
          local_208 = (int)std::setw(local_94);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffffa98,
                     (_Setw)(int)((ulong)in_stack_fffffffffffffaa0 >> 0x20));
          local_20c = (int)std::setprecision(local_90);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffffa98,
                     (_Setprecision)(int)((ulong)in_stack_fffffffffffffaa0 >> 0x20));
          local_70 = ::soplex::
                     VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                     ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                   *)in_stack_fffffffffffffaa0,
                                  (int)((ulong)in_stack_fffffffffffffa98 >> 0x20));
          local_68 = local_258;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)in_stack_fffffffffffffab0,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)in_stack_fffffffffffffaa8);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffffaa0,
                     (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                      *)in_stack_fffffffffffffa98);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffffaa0,
                     (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffa98);
          boost::multiprecision::
          number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
          ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                     *)0x135c1c);
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_78 + 8),local_200);
        }
      }
      if ((local_78 != -8) &&
         (VVar4 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_78 + 8)), 2 < (int)VVar4)) {
        local_25c = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_78 + 8));
        local_260 = INFO1;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_78 + 8),&local_260);
        in_stack_fffffffffffffaf8 =
             ::soplex::operator<<
                       ((SPxOut *)in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98);
        ::soplex::operator<<
                  ((SPxOut *)in_stack_fffffffffffffaa0,
                   (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffa98);
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_78 + 8),&local_25c);
      }
    }
    uVar2 = ::soplex::SoPlexBase<double>::isPrimalFeasible(in_stack_fffffffffffffaa0);
    if (((bool)uVar2) &&
       (uVar3 = ::soplex::SoPlexBase<double>::getPrimalRational
                          (in_stack_fffffffffffffaa8,
                           (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                            *)in_stack_fffffffffffffaa0), (bool)uVar3)) {
      local_264 = 0;
      if ((local_78 != -8) &&
         (VVar4 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_78 + 8)), 2 < (int)VVar4)) {
        local_268 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_78 + 8));
        local_26c = INFO1;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_78 + 8),&local_26c);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98);
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_78 + 8),&local_268);
      }
      local_270 = 0;
      while (iVar8 = local_270,
            iVar5 = ::soplex::SoPlexBase<double>::numColsRational((SoPlexBase<double> *)0x135e79),
            iVar8 < iVar5) {
        ::soplex::
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)in_stack_fffffffffffffaa0,(int)((ulong)in_stack_fffffffffffffa98 >> 0x20));
        local_2c0[1] = 0;
        local_18 = local_2b8;
        local_20 = local_2c0 + 1;
        local_28 = 0;
        local_30 = 0;
        local_10 = local_20;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)in_stack_fffffffffffffaf8,
                   (longlong *)
                   CONCAT17(uVar2,CONCAT16(uVar3,CONCAT24(in_stack_fffffffffffffaf4,iVar5))),
                   (type *)CONCAT44(iVar8,in_stack_fffffffffffffae8));
        bVar1 = boost::multiprecision::operator!=
                          ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)in_stack_fffffffffffffa98,
                           (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)0x135f31);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
        ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                   *)0x135f44);
        if (bVar1) {
          if ((local_78 != -8) &&
             (VVar4 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_78 + 8)), 2 < (int)VVar4)) {
            local_2c0[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_78 + 8));
            local_2c4 = INFO1;
            ::soplex::SPxOut::setVerbosity((SPxOut *)(local_78 + 8),&local_2c4);
            ::soplex::NameSet::operator[]
                      ((NameSet *)in_stack_fffffffffffffaa0,
                       (int)((ulong)in_stack_fffffffffffffa98 >> 0x20));
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98);
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98);
            local_60 = ::soplex::
                       VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                       ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                     *)in_stack_fffffffffffffaa0,
                                    (int)((ulong)in_stack_fffffffffffffa98 >> 0x20));
            local_58 = local_308;
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
            ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)in_stack_fffffffffffffab0,
                               (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)in_stack_fffffffffffffaa8);
            in_stack_fffffffffffffab0 =
                 ::soplex::operator<<
                           ((SPxOut *)in_stack_fffffffffffffaa0,
                            (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                             *)in_stack_fffffffffffffa98);
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffffaa0,
                       (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffa98);
            boost::multiprecision::
            number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
            ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                       *)0x13609b);
            ::soplex::SPxOut::setVerbosity((SPxOut *)(local_78 + 8),local_2c0);
          }
          local_264 = local_264 + 1;
        }
        local_270 = local_270 + 1;
      }
      if ((local_78 != -8) &&
         (VVar4 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_78 + 8)), 2 < (int)VVar4)) {
        local_314[2] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_78 + 8));
        local_314[1] = 3;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_78 + 8),local_314 + 1);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98);
        _spxout = ::soplex::operator<<
                            ((SPxOut *)in_stack_fffffffffffffaa0,
                             (int)((ulong)in_stack_fffffffffffffa98 >> 0x20));
        manip = ::soplex::operator<<(_spxout,(char *)in_stack_fffffffffffffa98);
        ::soplex::operator<<(_spxout,(_func_ostream_ptr_ostream_ptr *)manip);
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_78 + 8),local_314 + 2);
      }
    }
    else if ((local_78 != -8) &&
            (VVar4 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_78 + 8)), 2 < (int)VVar4)) {
      local_314[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_78 + 8));
      local_318 = INFO1;
      ::soplex::SPxOut::setVerbosity((SPxOut *)(local_78 + 8),&local_318);
      ::soplex::operator<<((SPxOut *)in_stack_fffffffffffffaa0,(char *)in_stack_fffffffffffffa98);
      ::soplex::SPxOut::setVerbosity((SPxOut *)(local_78 + 8),local_314);
    }
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                   *)0x1362d1);
  }
  return;
}

Assistant:

static
void printPrimalSolution(SoPlexBase<R>& soplex, NameSet& colnames, NameSet& rownames,
                         bool real = true, bool rational = false)
{
   int printprec;
   int printwidth;
   printprec = (int) - log10(Real(soplex.tolerances()->epsilon()));
   printwidth = printprec + 10;

   if(real)
   {
      VectorBase<R> primal(soplex.numCols());

      if(soplex.getPrimalRay(primal))
      {
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nPrimal ray (name, value):\n";)

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(isNotZero(primal[i], soplex.tolerances()->epsilon()))
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << colnames[i] << "\t"
                             << std::setw(printwidth) << std::setprecision(printprec)
                             << primal[i] << std::endl;)
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other entries are zero (within "
                       << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                       << std::setprecision(8) << std::fixed
                       << ")." << std::endl;)
      }
      else if(soplex.isPrimalFeasible() && soplex.getPrimal(primal))
      {
         int nNonzeros = 0;
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nPrimal solution (name, value):\n";)

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(isNotZero(primal[i], soplex.tolerances()->epsilon()))
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << colnames[i] << "\t"
                             << std::setw(printwidth) << std::setprecision(printprec)
                             << primal[i] << std::endl;)
               ++nNonzeros;
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other variables are zero (within "
                       << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                       << std::setprecision(8) << std::fixed
                       << "). Solution has " << nNonzeros << " nonzero entries." << std::endl;)
      }
      else
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "No primal information available.\n")
      }

   if(rational)
   {
      VectorRational primal(soplex.numCols());

      if(soplex.getPrimalRayRational(primal))
      {
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nPrimal ray (name, value):\n";)

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(primal[i] != (Rational) 0)
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << colnames[i] << "\t"
                             << std::setw(printwidth) << std::setprecision(printprec)
                             << primal[i] << std::endl;)
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other entries are zero." << std::endl;)
      }

      if(soplex.isPrimalFeasible() && soplex.getPrimalRational(primal))
      {
         int nNonzeros = 0;
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nPrimal solution (name, value):\n";)

         for(int i = 0; i < soplex.numColsRational(); ++i)
         {
            if(primal[i] != (Rational) 0)
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << colnames[i] << "\t" << primal[i] << std::endl;)
               ++nNonzeros;
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other variables are zero. Solution has "
                       << nNonzeros << " nonzero entries." << std::endl;)
      }
      else
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "No primal (rational) solution available.\n")

      }
}